

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
create_superroot(Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this
                )

{
  short sVar1;
  AlexNode<int,_int> *pAVar2;
  model_node_type *pmVar3;
  AlexNode<int,_int> **ppAVar4;
  
  if (this->root_node_ != (AlexNode<int,_int> *)0x0) {
    delete_node(this,&this->superroot_->super_AlexNode<int,_int>);
    pmVar3 = (model_node_type *)operator_new(0x40);
    sVar1 = this->root_node_->level_;
    (pmVar3->super_AlexNode<int,_int>).is_leaf_ = false;
    (pmVar3->super_AlexNode<int,_int>).duplication_factor_ = '\0';
    (pmVar3->super_AlexNode<int,_int>).level_ = sVar1 + -1;
    (pmVar3->super_AlexNode<int,_int>).model_.a_ = 0.0;
    (pmVar3->super_AlexNode<int,_int>).model_.b_ = 0.0;
    (pmVar3->super_AlexNode<int,_int>).cost_ = 0.0;
    (pmVar3->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)&PTR__AlexModelNode_00116cd8;
    pmVar3->allocator_ = (allocator<std::pair<int,_int>_> *)&this->field_0xbd;
    pmVar3->num_children_ = 0;
    pmVar3->children_ = (AlexNode<int,_int> **)0x0;
    this->superroot_ = pmVar3;
    pmVar3->num_children_ = 1;
    ppAVar4 = (AlexNode<int,_int> **)operator_new(8);
    pmVar3 = this->superroot_;
    pmVar3->children_ = ppAVar4;
    pAVar2 = this->root_node_;
    *ppAVar4 = pAVar2;
    (pmVar3->super_AlexNode<int,_int>).level_ = pAVar2->level_ + -1;
  }
  return;
}

Assistant:

void create_superroot() {
    if (!root_node_) return;
    delete_node(superroot_);
    superroot_ = new (model_node_allocator().allocate(1))
        model_node_type(static_cast<short>(root_node_->level_ - 1), allocator_);
    superroot_->num_children_ = 1;
    superroot_->children_ =
        new (pointer_allocator().allocate(1)) AlexNode<T, P>*[1];
    update_superroot_pointer();
  }